

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O1

double __thiscall
trento::MonteCarloCrossSection::operator()(MonteCarloCrossSection *this,double sigma_partonic)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  double *pdVar6;
  out_of_range *this_00;
  ulong uVar7;
  allocator_type *__a;
  allocator_type *__a_00;
  iterator __end2_1;
  iterator __end2;
  Constituent *qB;
  int iVar8;
  Constituent *q;
  double *pdVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM6 [16];
  CyclicNormal<double> cyclic_normal;
  vector<Constituent,_std::allocator<Constituent>_> nucleonB;
  vector<Constituent,_std::allocator<Constituent>_> nucleonA;
  CyclicNormal<double> local_110;
  double local_e0;
  double *local_d8;
  int local_cc;
  double local_c8;
  undefined8 uStack_c0;
  double local_b0;
  ulong local_a8;
  double local_a0;
  double *local_98;
  double *local_90;
  double *local_80;
  double *local_78;
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  undefined1 extraout_var [56];
  
  local_c8 = sigma_partonic;
  uStack_c0 = in_XMM0_Qb;
  random::CyclicNormal<double>::CyclicNormal
            (&local_110,0.0,this->sampling_width_,this->cache_size,this->n_loops);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(&local_80,this->constituent_number_,__a);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(&local_98,this->constituent_number_,__a_00);
  pdVar6 = local_98;
  bVar10 = this->n_max != 0;
  if (bVar10) {
    local_d8 = local_80;
    auVar4._8_8_ = uStack_c0;
    auVar4._0_8_ = local_c8;
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    local_58 = vxorpd_avx512vl(auVar4,auVar12);
    local_b0 = this->max_impact_ * this->max_impact_ * 3.141592653589793;
    dVar11 = 0.0;
    dVar13 = 0.0;
    iVar8 = 0;
    uVar7 = 0;
    do {
      uStack_40 = 0;
      local_c8 = this->max_impact_;
      local_a8 = uVar7;
      local_a0 = dVar13;
      local_48 = dVar11;
      auVar14._0_8_ =
           std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                       *)&random::engine);
      auVar14._8_56_ = extraout_var;
      local_cc = iVar8;
      if (auVar14._0_8_ < 0.0) {
        local_e0 = sqrt(auVar14._0_8_);
        pdVar5 = local_d8;
      }
      else {
        auVar12 = vsqrtsd_avx(auVar14._0_16_,auVar14._0_16_);
        local_e0 = auVar12._0_8_;
        pdVar5 = local_d8;
      }
      for (; pdVar9 = pdVar6, pdVar5 != local_78; pdVar5 = pdVar5 + 2) {
        if (local_110.n_loops_ < local_110.loop_count) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_110.loop_count = 0;
        }
        if (local_110.iter_._M_current ==
            local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_110.iter_._M_current =
               local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_110.loop_count = local_110.loop_count + 1;
        }
        pdVar9 = local_110.iter_._M_current + 1;
        *pdVar5 = *local_110.iter_._M_current;
        local_110.iter_._M_current = pdVar9;
        if (local_110.n_loops_ < local_110.loop_count) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_110.loop_count = 0;
        }
        if (local_110.iter_._M_current ==
            local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_110.iter_._M_current =
               local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_110.loop_count = local_110.loop_count + 1;
        }
        pdVar5[1] = *local_110.iter_._M_current;
        local_110.iter_._M_current = local_110.iter_._M_current + 1;
      }
      for (; pdVar9 != local_90; pdVar9 = pdVar9 + 2) {
        if (local_110.n_loops_ < local_110.loop_count) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_110.loop_count = 0;
        }
        if (local_110.iter_._M_current ==
            local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_110.iter_._M_current =
               local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_110.loop_count = local_110.loop_count + 1;
        }
        pdVar5 = local_110.iter_._M_current + 1;
        *pdVar9 = *local_110.iter_._M_current;
        local_110.iter_._M_current = pdVar5;
        if (local_110.n_loops_ < local_110.loop_count) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_110.loop_count = 0;
        }
        if (local_110.iter_._M_current ==
            local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_110.iter_._M_current =
               local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_110.loop_count = local_110.loop_count + 1;
        }
        pdVar9[1] = *local_110.iter_._M_current;
        local_110.iter_._M_current = local_110.iter_._M_current + 1;
      }
      if (local_d8 == local_78) {
        dVar13 = 0.0;
      }
      else {
        dVar11 = local_e0 * local_c8;
        dVar13 = 0.0;
        local_e0 = dVar11;
        pdVar5 = pdVar6;
        pdVar9 = local_d8;
        do {
          for (; pdVar5 != local_90; pdVar5 = pdVar5 + 2) {
            dVar11 = dVar11 + (*pdVar9 - *pdVar5);
            local_c8 = dVar13;
            dVar13 = exp(((dVar11 * dVar11 + (pdVar9[1] - pdVar5[1]) * (pdVar9[1] - pdVar5[1])) *
                         -0.25) / this->constituent_width_sq_);
            dVar13 = local_c8 + dVar13;
            dVar11 = local_e0;
          }
          pdVar9 = pdVar9 + 2;
          pdVar5 = pdVar6;
        } while (pdVar9 != local_78);
      }
      auVar12 = vcvtusi2sd_avx512f(in_XMM6,this->constituent_number_);
      dVar13 = exp(dVar13 * (((double)local_58._0_8_ * this->prefactor_) /
                            (auVar12._0_8_ + auVar12._0_8_)));
      dVar13 = local_a0 + dVar13;
      auVar12 = vcvtusi2sd_avx512f(in_XMM6,local_a8);
      dVar11 = (1.0 - dVar13 / auVar12._0_8_) * local_b0;
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar11 - local_48;
      auVar12 = vandpd_avx512vl(auVar15,auVar3);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = this->tolerance;
      iVar8 = local_cc + 1;
      if (this->tolerance <= auVar12._0_8_) {
        iVar8 = 0;
      }
      iVar1 = this->n_pass;
      local_68 = (double)((ulong)(iVar1 < iVar8) * (long)dVar11 +
                         (ulong)(iVar8 <= iVar1) * (long)local_68);
      if (iVar1 < iVar8) break;
      uVar2 = vcmpsd_avx512f(auVar12,auVar16,1);
      bVar10 = (bool)((byte)uVar2 & 1);
      dVar11 = (double)((ulong)bVar10 * (long)local_48 + (ulong)!bVar10 * (long)dVar11);
      uVar7 = local_a8 + 1;
      bVar10 = uVar7 < this->n_max;
    } while (bVar10);
  }
  if (bVar10) {
    if (local_98 != (double *)0x0) {
      operator_delete(local_98);
    }
    if (local_80 != (double *)0x0) {
      operator_delete(local_80);
    }
    if (local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_110.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return local_68;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,
             "Partonic cross section failed to converge       -- check nucleon width, constituent width, and constituent number"
            );
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

double MonteCarloCrossSection::operator() (const double sigma_partonic) const {

  random::CyclicNormal<> cyclic_normal{
    0., sampling_width_, cache_size, n_loops
  };

  struct Constituent {
    double x, y;
  };

  std::vector<Constituent> nucleonA(constituent_number_);
  std::vector<Constituent> nucleonB(constituent_number_);

  auto max_impact_sq_ = sqr(max_impact_);
  double ref_cross_section = 0.;
  double prob_miss = 0.;
  int pass_tolerance = 0;

  for (std::size_t n = 0; n < n_max; ++n) {
    // Sample b from P(b)db = 2*pi*b.
    auto b = max_impact_ * std::sqrt(random::canonical<double>());

    for (auto&& q : nucleonA) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    for (auto&& q : nucleonB) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    auto overlap = 0.;
    for (auto&& qA : nucleonA) {
      for (auto&& qB : nucleonB) {
        auto distance_sq = sqr(qA.x - qB.x + b) + sqr(qA.y - qB.y);
        overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
      }
    }

    prob_miss +=
      std::exp(-sigma_partonic * prefactor_/(2.*constituent_number_) * overlap);

    auto prob_hit = 1. - (prob_miss/n);
    auto cross_section = M_PI*max_impact_sq_*prob_hit;

    auto update_difference = std::abs(cross_section - ref_cross_section);

    if (update_difference < tolerance) {
      ++pass_tolerance;
    } else {
      pass_tolerance = 0;
      ref_cross_section = cross_section;
    }

    if (pass_tolerance > n_pass){
      return cross_section;
    }
  }

  throw std::out_of_range{
    "Partonic cross section failed to converge \
      -- check nucleon width, constituent width, and constituent number"};
}